

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O1

void __thiscall Diligent::DeviceContextGLImpl::EndSubpass(DeviceContextGLImpl *this)

{
  uint uVar1;
  Uint32 srcX1;
  Uint32 srcY1;
  SubpassDesc *pSVar2;
  FramebufferGLImpl *pFVar3;
  int iVar4;
  GLuint GVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  TextureFormatAttribs *pTVar9;
  undefined4 uVar10;
  char (*in_RCX) [37];
  RenderPassAttachmentDesc *pRVar11;
  int iVar12;
  int iVar13;
  RenderPassGLImpl *pRVar14;
  ulong uVar15;
  GLenum err;
  string msg;
  GLint glCurrReadFB;
  undefined4 uStack_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  pointer local_40;
  RenderPassGLImpl *local_38;
  
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject ==
      (RenderPassGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pActiveRenderPass",
               (char (*) [20])in_RCX);
    in_RCX = (char (*) [37])0x221;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x221);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.m_pObject ==
      (FramebufferGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pBoundFramebuffer",
               (char (*) [20])in_RCX);
    in_RCX = (char (*) [37])0x222;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x222);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pRVar14 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
            m_pObject;
  if ((pRVar14->super_RenderPassBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
      .m_Desc.SubpassCount <=
      (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex) {
    FormatString<char[26],char[37]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SubpassIndex < RPDesc.SubpassCount",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x224);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  uVar1 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex;
  pSVar2 = (pRVar14->super_RenderPassBase<Diligent::EngineGLImplTraits>).
           super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
           .m_Desc.pSubpasses;
  local_40 = (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.
              m_pObject)->m_SubpassFramebuffers).
             super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar1;
  glCurrReadFB = 0;
  glGetIntegerv(0x8caa,&glCurrReadFB);
  err = glGetError();
  local_38 = pRVar14;
  if (err != 0) {
    LogError<false,char[39],char[17],unsigned_int>
              (false,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22c,(char (*) [39])"Failed to get current read framebuffer",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x861532);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pRVar14 = local_38;
  iVar4 = (local_40->RenderTarget).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
          m_uiHandle;
  if (iVar4 == 0) {
    iVar4 = (**(code **)(*(long *)(this->m_pSwapChain).m_pObject + 0x60))();
  }
  if (glCurrReadFB != iVar4) {
    FormatString<char[28]>(&msg,(char (*) [28])"Unexpected read framebuffer");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (pSVar2[uVar1].pResolveAttachments != (AttachmentReference *)0x0) {
    GVar5 = (local_40->Resolve).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
            m_uiHandle;
    if (GVar5 == 0) {
      GVar5 = (**(code **)(*(long *)(this->m_pSwapChain).m_pObject + 0x60))();
    }
    (*__glewBindFramebuffer)(0x8ca9,GVar5);
    glCurrReadFB = glGetError();
    if (glCurrReadFB != 0) {
      LogError<false,char[59],char[17],unsigned_int>
                (false,"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x23a,(char (*) [59])"Failed to bind resolve destination FBO as draw framebuffer",
                 (char (*) [17])"\nGL Error Code: ",(uint *)&glCurrReadFB);
      FormatString<char[6]>(&msg,(char (*) [6])0x861532);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x23a);
      pRVar14 = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        pRVar14 = local_38;
      }
    }
    pFVar3 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.
             m_pObject;
    srcX1 = (pFVar3->super_FramebufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            .m_Desc.Width;
    srcY1 = (pFVar3->super_FramebufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            .m_Desc.Height;
    GLContextState::BlitFramebufferNoScissor
              (&this->m_ContextState,0,0,srcX1,srcY1,0,0,srcX1,srcY1,0x4000,0x2600);
  }
  if (__glewInvalidateFramebuffer == (PFNGLINVALIDATEFRAMEBUFFERPROC)0x0) goto LAB_00329c8a;
  if (pSVar2[uVar1].RenderTargetAttachmentCount == 0) {
    iVar4 = 0;
  }
  else {
    uVar15 = 0;
    iVar4 = 0;
    do {
      uVar7 = (ulong)pSVar2[uVar1].pRenderTargetAttachments[uVar15].AttachmentIndex;
      if (((uVar7 != 0xffffffff) &&
          ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex ==
           (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
            m_pObject)->super_RenderPassBase<Diligent::EngineGLImplTraits>).m_AttachmentFirstLastUse
           [uVar7].second)) &&
         ((pRVar14->super_RenderPassBase<Diligent::EngineGLImplTraits>).
          super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
          .m_Desc.pAttachments[uVar7].StoreOp == ATTACHMENT_STORE_OP_DISCARD)) {
        if ((local_40->RenderTarget).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
            m_uiHandle == 0) {
          iVar13 = 0x1800;
          if (uVar15 != 0) {
            FormatString<char[58]>
                      ((string *)&glCurrReadFB,
                       (char (*) [58])"Default framebuffer can only have single color attachment");
            DebugAssertionFailed
                      ((Char *)CONCAT44(uStack_5c,glCurrReadFB),"EndSubpass",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                       ,0x256);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(uStack_5c,glCurrReadFB) != &local_50) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(uStack_5c,glCurrReadFB),local_50._M_allocated_capacity + 1
                             );
            }
          }
        }
        else {
          iVar13 = (int)uVar15 + 0x8ce0;
        }
        lVar8 = (long)iVar4;
        iVar4 = iVar4 + 1;
        *(int *)((long)&msg._M_dataplus._M_p + lVar8 * 4) = iVar13;
        pRVar14 = local_38;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < pSVar2[uVar1].RenderTargetAttachmentCount);
  }
  iVar13 = iVar4;
  if (((pSVar2[uVar1].pDepthStencilAttachment != (AttachmentReference *)0x0) &&
      (uVar15 = (ulong)(pSVar2[uVar1].pDepthStencilAttachment)->AttachmentIndex,
      uVar15 != 0xffffffff)) &&
     ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex ==
      (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject)
      ->super_RenderPassBase<Diligent::EngineGLImplTraits>).m_AttachmentFirstLastUse[uVar15].second)
     ) {
    pRVar11 = (pRVar14->super_RenderPassBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
              .m_Desc.pAttachments;
    if (pRVar11[uVar15].StoreOp == ATTACHMENT_STORE_OP_DISCARD) {
      pRVar11 = pRVar11 + uVar15;
      pTVar9 = GetTextureFormatAttribs(pRVar11->Format);
      if (1 < (byte)(pTVar9->ComponentType - COMPONENT_TYPE_DEPTH)) {
        FormatString<char[26],char[109]>
                  ((string *)&glCurrReadFB,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH || FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL"
                   ,(char (*) [109])pRVar11);
        DebugAssertionFailed
                  ((Char *)CONCAT44(uStack_5c,glCurrReadFB),"EndSubpass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x26a);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_5c,glCurrReadFB) != &local_50) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_5c,glCurrReadFB),local_50._M_allocated_capacity + 1);
        }
      }
      if ((local_40->RenderTarget).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
          m_uiHandle == 0) {
        iVar13 = iVar4 + 1;
        *(undefined4 *)((long)&msg._M_dataplus._M_p + (long)iVar4 * 4) = 0x1801;
        if (pTVar9->ComponentType != COMPONENT_TYPE_DEPTH_STENCIL) goto LAB_00329bdf;
        uVar10 = 0x1802;
        iVar12 = 2;
        iVar6 = iVar13;
      }
      else {
        uVar10 = 0x821a;
        if (pTVar9->ComponentType == COMPONENT_TYPE_DEPTH) {
          uVar10 = 0x8d00;
        }
        iVar12 = 1;
        iVar6 = iVar4;
      }
      iVar13 = iVar4 + iVar12;
      *(undefined4 *)((long)&msg._M_dataplus._M_p + (long)iVar6 * 4) = uVar10;
    }
  }
LAB_00329bdf:
  if (0 < iVar13) {
    (*__glewInvalidateFramebuffer)(0x8ca8,iVar13,(GLenum *)&msg);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[33],char[17],unsigned_int>
                (false,"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x27c,(char (*) [33])"glInvalidateFramebuffer() failed",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>((string *)&glCurrReadFB,(char (*) [6])0x861532);
      DebugAssertionFailed
                ((Char *)CONCAT44(uStack_5c,glCurrReadFB),"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x27c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_5c,glCurrReadFB) != &local_50) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_5c,glCurrReadFB),local_50._M_allocated_capacity + 1);
      }
    }
  }
LAB_00329c8a:
  (this->m_ContextState).m_FBOId = -1;
  return;
}

Assistant:

void DeviceContextGLImpl::EndSubpass()
{
    VERIFY_EXPR(m_pActiveRenderPass);
    VERIFY_EXPR(m_pBoundFramebuffer);
    const RenderPassDesc& RPDesc = m_pActiveRenderPass->GetDesc();
    VERIFY_EXPR(m_SubpassIndex < RPDesc.SubpassCount);
    const SubpassDesc& SubpassDesc = RPDesc.pSubpasses[m_SubpassIndex];

    const FramebufferGLImpl::SubpassFramebuffers& SubpassFBOs = m_pBoundFramebuffer->GetSubpassFramebuffer(m_SubpassIndex);
#ifdef DILIGENT_DEBUG
    {
        GLint glCurrReadFB = 0;
        glGetIntegerv(GL_READ_FRAMEBUFFER_BINDING, &glCurrReadFB);
        DEV_CHECK_GL_ERROR("Failed to get current read framebuffer");
        GLuint glExpectedReadFB = SubpassFBOs.RenderTarget != 0 ? static_cast<GLuint>(SubpassFBOs.RenderTarget) : m_pSwapChain->GetDefaultFBO();
        VERIFY(static_cast<GLuint>(glCurrReadFB) == glExpectedReadFB, "Unexpected read framebuffer");
    }
#endif

    if (SubpassDesc.pResolveAttachments != nullptr)
    {
        GLuint ResolveDstFBO = SubpassFBOs.Resolve;
        if (ResolveDstFBO == 0)
        {
            ResolveDstFBO = m_pSwapChain.RawPtr<ISwapChainGL>()->GetDefaultFBO();
        }
        glBindFramebuffer(GL_DRAW_FRAMEBUFFER, ResolveDstFBO);
        DEV_CHECK_GL_ERROR("Failed to bind resolve destination FBO as draw framebuffer");

        const FramebufferDesc& FBODesc = m_pBoundFramebuffer->GetDesc();
        m_ContextState.BlitFramebufferNoScissor(
            0, 0, static_cast<GLint>(FBODesc.Width), static_cast<GLint>(FBODesc.Height),
            0, 0, static_cast<GLint>(FBODesc.Width), static_cast<GLint>(FBODesc.Height),
            GL_COLOR_BUFFER_BIT,
            GL_NEAREST // Filter is ignored
        );
    }

    if (glInvalidateFramebuffer != nullptr)
    {
        // It is crucially important to invalidate the framebuffer while it is bound
        // https://community.arm.com/developer/tools-software/graphics/b/blog/posts/mali-performance-2-how-to-correctly-handle-framebuffers
        GLsizei InvalidateAttachmentsCount = 0;

        std::array<GLenum, MAX_RENDER_TARGETS + 1> InvalidateAttachments;
        for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
        {
            const Uint32 RTAttachmentIdx = SubpassDesc.pRenderTargetAttachments[rt].AttachmentIndex;
            if (RTAttachmentIdx != ATTACHMENT_UNUSED)
            {
                auto AttachmentLastUse = m_pActiveRenderPass->GetAttachmentFirstLastUse(RTAttachmentIdx).second;
                if (AttachmentLastUse == m_SubpassIndex && RPDesc.pAttachments[RTAttachmentIdx].StoreOp == ATTACHMENT_STORE_OP_DISCARD)
                {
                    if (SubpassFBOs.RenderTarget == 0)
                    {
                        VERIFY(rt == 0, "Default framebuffer can only have single color attachment");
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_COLOR;
                    }
                    else
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_COLOR_ATTACHMENT0 + rt;
                    }
                }
            }
        }

        if (SubpassDesc.pDepthStencilAttachment != nullptr)
        {
            const Uint32 DSAttachmentIdx = SubpassDesc.pDepthStencilAttachment->AttachmentIndex;
            if (DSAttachmentIdx != ATTACHMENT_UNUSED)
            {
                auto AttachmentLastUse = m_pActiveRenderPass->GetAttachmentFirstLastUse(DSAttachmentIdx).second;
                if (AttachmentLastUse == m_SubpassIndex && RPDesc.pAttachments[DSAttachmentIdx].StoreOp == ATTACHMENT_STORE_OP_DISCARD)
                {
                    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(RPDesc.pAttachments[DSAttachmentIdx].Format);
                    VERIFY_EXPR(FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH || FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL);
                    if (SubpassFBOs.RenderTarget == 0)
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_DEPTH;
                        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
                            InvalidateAttachments[InvalidateAttachmentsCount++] = GL_STENCIL;
                    }
                    else
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ? GL_DEPTH_ATTACHMENT : GL_DEPTH_STENCIL_ATTACHMENT;
                    }
                }
            }
        }

        if (InvalidateAttachmentsCount > 0)
        {
            glInvalidateFramebuffer(GL_READ_FRAMEBUFFER, InvalidateAttachmentsCount, InvalidateAttachments.data());
            DEV_CHECK_GL_ERROR("glInvalidateFramebuffer() failed");
        }
    }

    // TODO: invalidate input attachments using glInvalidateTexImage

    m_ContextState.InvalidateFBO();
}